

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::identifier(Parser *this)

{
  Node *this_00;
  string local_88 [32];
  Node *local_68;
  Node *identifier_node;
  undefined1 local_50 [8];
  string variable_str;
  Parser local_30;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  eat_abi_cxx11_(&local_30,(token_type)this);
  std::__cxx11::string::~string((string *)&local_30);
  Lexer::current_token(this->lex);
  Token::get_lexeme_abi_cxx11_((Token *)local_50);
  Lexer::next_token(this->lex);
  this_00 = (Node *)operator_new(0x48);
  std::__cxx11::string::string(local_88,(string *)local_50);
  Node::Node(this_00,VARIABLE,(Node *)0x0,(Node *)0x0,(string *)local_88,(Node *)0x0,(Node *)0x0);
  std::__cxx11::string::~string(local_88);
  local_68 = this_00;
  std::__cxx11::string::~string((string *)local_50);
  return this_00;
}

Assistant:

Node* Parser::identifier()
{
	eat(token_type::IDENTIFIER);

	string variable_str = lex->current_token()->get_lexeme();
	lex->next_token();

	Node* identifier_node = new Node(node_type::VARIABLE, nullptr, nullptr, variable_str);
	return identifier_node;
}